

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManMuxesDeref(Aig_Man_t *pAig,Vec_Ptr_t *vMuxes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int i;
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  for (i = 0; i < vMuxes->nSize; i = i + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vMuxes,i);
    iVar1 = Aig_ObjRecognizeExor(pAVar2,&local_38,&local_40);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjRecognizeMux(pAVar2,&local_38,&local_40);
    }
    else {
      *(ulong *)&local_38->field_0x18 =
           *(ulong *)&local_38->field_0x18 & 0xffffffff0000003f |
           (ulong)((int)*(ulong *)&local_38->field_0x18 - 0x40U & 0xffffffc0);
      pAVar2 = local_40;
    }
    *(ulong *)&pAVar2->field_0x18 =
         *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
         (ulong)((int)*(ulong *)&pAVar2->field_0x18 - 0x40U & 0xffffffc0);
  }
  return;
}

Assistant:

void Aig_ManMuxesDeref( Aig_Man_t * pAig, Vec_Ptr_t * vMuxes )
{
    Aig_Obj_t * pObj, * pNodeT, * pNodeE, * pNodeC;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMuxes, pObj, i )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pNodeT, &pNodeE ) )
        {
            pNodeT->nRefs--;
            pNodeE->nRefs--;
        }
        else
        {
            pNodeC = Aig_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
            pNodeC->nRefs--;
        }
    }
}